

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

csv_parse_state __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::pop_state
          (basic_csv_parser<char,_std::allocator<char>_> *this)

{
  csv_parse_state cVar1;
  bool bVar2;
  assertion_error *this_00;
  reference pvVar3;
  vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_> *in_RDI;
  csv_parse_state state;
  string *in_stack_ffffffffffffff98;
  vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
  *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar2 = std::
          vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>::
          empty(in_RDI);
  if (!bVar2) {
    pvVar3 = std::
             vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
             ::back(in_stack_ffffffffffffffa0);
    cVar1 = *pvVar3;
    std::vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>::
    pop_back((vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
              *)0x3f6543);
    return cVar1;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  assertion_error::assertion_error(this_00,in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

csv_parse_state pop_state()
    {
        JSONCONS_ASSERT(!state_stack_.empty())
        csv_parse_state state = state_stack_.back();
        state_stack_.pop_back();
        return state;
    }